

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Help_View.cxx
# Opt level: O0

int __thiscall Fl_Help_View::find(Fl_Help_View *this,char *s,int p)

{
  int iVar1;
  int iVar2;
  size_t sVar3;
  char *pcVar4;
  bool bVar5;
  char *local_50;
  char *sp;
  char *bs;
  char *bp;
  Fl_Help_Block *b;
  int local_28;
  int c;
  int i;
  int p_local;
  char *s_local;
  Fl_Help_View *this_local;
  
  if ((s != (char *)0x0) && (this->value_ != (char *)0x0)) {
    if ((p < 0) || (sVar3 = strlen(this->value_), (int)sVar3 <= p)) {
      c = 0;
    }
    else {
      c = p;
      if (0 < p) {
        c = p + 1;
      }
    }
    bp = (char *)this->blocks_;
    for (local_28 = this->nblocks_; 0 < local_28; local_28 = local_28 + -1) {
      if (this->value_ + c <= *(char **)(bp + 8)) {
        if (*(char **)bp < this->value_ + c) {
          bs = this->value_ + c;
        }
        else {
          bs = *(char **)bp;
        }
        sp = bs;
        local_50 = s;
        while( true ) {
          bVar5 = false;
          if ((*local_50 != '\0') && (bVar5 = false, *bs != '\0')) {
            bVar5 = bs < *(char **)(bp + 8);
          }
          if (!bVar5) break;
          if (*bs == '<') {
            while( true ) {
              bVar5 = false;
              if ((*bs != '\0') && (bVar5 = false, bs < *(char **)(bp + 8))) {
                bVar5 = *bs != '>';
              }
              if (!bVar5) break;
              bs = bs + 1;
            }
          }
          else {
            if (*bs == '&') {
              b._4_4_ = quote_char(bs + 1);
              if (b._4_4_ < 0) {
                b._4_4_ = 0x26;
              }
              else {
                pcVar4 = strchr(bs + 1,0x3b);
                bs = pcVar4 + 1;
              }
            }
            else {
              b._4_4_ = (int)*bs;
            }
            iVar1 = tolower((int)*local_50);
            iVar2 = tolower(b._4_4_);
            if (iVar1 == iVar2) {
              local_50 = local_50 + 1;
            }
            else {
              sp = sp + 1;
              local_50 = s;
              bs = sp;
            }
          }
          bs = bs + 1;
        }
        if (*local_50 == '\0') {
          topline(this,*(int *)(bp + 0x1c) - *(int *)(bp + 0x24));
          return (int)*(undefined8 *)(bp + 8) - (int)this->value_;
        }
      }
      bp = bp + 0xa8;
    }
  }
  return -1;
}

Assistant:

int						// O - Matching position or -1 if not found
Fl_Help_View::find(const char *s,		// I - String to find
                   int        p)		// I - Starting position
{
  int		i,				// Looping var
		c;				// Current character
  Fl_Help_Block	*b;				// Current block
  const char	*bp,				// Block matching pointer
		*bs,				// Start of current comparison
		*sp;				// Search string pointer


  DEBUG_FUNCTION(__LINE__,__FUNCTION__);

  // Range check input and value...
  if (!s || !value_) return -1;

  if (p < 0 || p >= (int)strlen(value_)) p = 0;
  else if (p > 0) p ++;

  // Look for the string...
  for (i = nblocks_, b = blocks_; i > 0; i --, b ++) {
    if (b->end < (value_ + p))
      continue;

    if (b->start < (value_ + p)) bp = value_ + p;
    else bp = b->start;

    for (sp = s, bs = bp; *sp && *bp && bp < b->end; bp ++) {
      if (*bp == '<') {
        // skip to end of element...
	while (*bp && bp < b->end && *bp != '>') bp ++;
	continue;
      } else if (*bp == '&') {
        // decode HTML entity...
	if ((c = quote_char(bp + 1)) < 0) c = '&';	// *FIXME* UTF-8, see below
	else bp = strchr(bp + 1, ';') + 1;
      } else c = *bp;

      // *FIXME* *UTF-8* (A.S. 02/14/2016)
      // At this point c may be an arbitrary Unicode Code Point corresponding
      // to a quoted character (see above), i.e. it _can_ be a multi byte
      // UTF-8 sequence and must be compared with the corresponding
      // multi byte string in (*sp)...
      // For instance: "&euro;" == 0x20ac -> 0xe2 0x82 0xac (UTF-8: 3 bytes).
      // Hint: use fl_utf8encode() [see below]

      if (tolower(*sp) == tolower(c)) sp ++;
      else {
        // No match, so reset to start of search...
	sp = s;
	bs ++;
	bp = bs;
      }
    }

    if (!*sp) {
      // Found a match!
      topline(b->y - b->h);
      return (int) (b->end - value_);
    }
  }

  // No match!
  return (-1);
}